

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

void __thiscall adios2::Engine::Put(Engine *this,VariableNT *variable,void *data,Mode launch)

{
  Engine *pointer;
  int iVar1;
  undefined4 in_register_0000000c;
  Mode MVar2;
  VariableBase *pVVar3;
  string local_70;
  string local_50;
  
  pointer = this->m_Engine;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"in call to Engine::Put","",CONCAT44(in_register_0000000c,launch));
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pVVar3 = variable->m_Variable;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"for variable in call to Engine::Put","");
  helper::CheckForNullptr<adios2::core::VariableBase>(pVVar3,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pVVar3 = variable->m_Variable;
  iVar1 = *(int *)((string *)pVVar3 + 0x28);
  MVar2 = (Mode)data;
  if (iVar1 == 0xe) {
    adios2::core::Engine::Put<std::__cxx11::string>
              ((Variable *)this->m_Engine,(string *)pVVar3,MVar2);
    pVVar3 = variable->m_Variable;
    iVar1 = *(int *)((string *)pVVar3 + 0x28);
  }
  if (iVar1 == 0xf) {
    adios2::core::Engine::Put<char>((Variable *)this->m_Engine,(char *)pVVar3,MVar2);
    pVVar3 = variable->m_Variable;
    iVar1 = *(int *)(pVVar3 + 0x28);
  }
  if (iVar1 == 1) {
    adios2::core::Engine::Put<signed_char>((Variable *)this->m_Engine,(signed *)pVVar3,MVar2);
    pVVar3 = variable->m_Variable;
    iVar1 = *(int *)(pVVar3 + 0x28);
  }
  if (iVar1 == 2) {
    adios2::core::Engine::Put<short>((Variable *)this->m_Engine,(short *)pVVar3,MVar2);
    pVVar3 = variable->m_Variable;
    iVar1 = *(int *)(pVVar3 + 0x28);
  }
  if (iVar1 == 3) {
    adios2::core::Engine::Put<int>((Variable *)this->m_Engine,(int *)pVVar3,MVar2);
    pVVar3 = variable->m_Variable;
    iVar1 = *(int *)(pVVar3 + 0x28);
  }
  if (iVar1 == 4) {
    adios2::core::Engine::Put<long>((Variable *)this->m_Engine,(long *)pVVar3,MVar2);
    pVVar3 = variable->m_Variable;
    iVar1 = *(int *)(pVVar3 + 0x28);
  }
  if (iVar1 == 5) {
    adios2::core::Engine::Put<unsigned_char>((Variable *)this->m_Engine,(uchar *)pVVar3,MVar2);
    pVVar3 = variable->m_Variable;
    iVar1 = *(int *)(pVVar3 + 0x28);
  }
  if (iVar1 == 6) {
    adios2::core::Engine::Put<unsigned_short>((Variable *)this->m_Engine,(ushort *)pVVar3,MVar2);
    pVVar3 = variable->m_Variable;
    iVar1 = *(int *)(pVVar3 + 0x28);
  }
  if (iVar1 == 7) {
    adios2::core::Engine::Put<unsigned_int>((Variable *)this->m_Engine,(uint *)pVVar3,MVar2);
    pVVar3 = variable->m_Variable;
    iVar1 = *(int *)(pVVar3 + 0x28);
  }
  if (iVar1 == 8) {
    adios2::core::Engine::Put<unsigned_long>((Variable *)this->m_Engine,(ulong *)pVVar3,MVar2);
    pVVar3 = variable->m_Variable;
    iVar1 = *(int *)(pVVar3 + 0x28);
  }
  if (iVar1 == 9) {
    adios2::core::Engine::Put<float>((Variable *)this->m_Engine,(float *)pVVar3,MVar2);
    pVVar3 = variable->m_Variable;
    iVar1 = *(int *)(pVVar3 + 0x28);
  }
  if (iVar1 == 10) {
    adios2::core::Engine::Put<double>((Variable *)this->m_Engine,(double *)pVVar3,MVar2);
    pVVar3 = variable->m_Variable;
    iVar1 = *(int *)(pVVar3 + 0x28);
  }
  if (iVar1 == 0xb) {
    adios2::core::Engine::Put<long_double>((Variable *)this->m_Engine,(longdouble *)pVVar3,MVar2);
    pVVar3 = variable->m_Variable;
    iVar1 = *(int *)(pVVar3 + 0x28);
  }
  if (iVar1 == 0xc) {
    adios2::core::Engine::Put<std::complex<float>>
              ((Variable *)this->m_Engine,(complex *)pVVar3,MVar2);
    pVVar3 = variable->m_Variable;
    iVar1 = *(int *)(pVVar3 + 0x28);
  }
  if (iVar1 == 0x10) {
    adios2::core::Engine::Put((VariableStruct *)this->m_Engine,pVVar3,MVar2);
  }
  else if (iVar1 == 0xd) {
    adios2::core::Engine::Put<std::complex<double>>
              ((Variable *)this->m_Engine,(complex *)pVVar3,MVar2);
  }
  return;
}

Assistant:

void Engine::Put(VariableNT &variable, const void *data, const Mode launch)
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::Put");
    helper::CheckForNullptr(variable.m_Variable, "for variable in call to Engine::Put");
#define declare_type(T)                                                                            \
    if (variable.m_Variable->m_Type == helper::GetDataType<T>())                                   \
    {                                                                                              \
        m_Engine->Put(*reinterpret_cast<core::Variable<T> *>(variable.m_Variable),                 \
                      reinterpret_cast<const T *>(data), launch);                                  \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else if (variable.m_Variable->m_Type == DataType::Struct)
    {
        m_Engine->Put(*reinterpret_cast<core::VariableStruct *>(variable.m_Variable), data, launch);
    }
}